

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O3

Behavior * __thiscall
Lodtalk::StackInterpreter::getLookupClass(StackInterpreter *this,Oop receiver,bool superLookup)

{
  uint uVar1;
  Oop OVar2;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar3;
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,superLookup) == 0) {
    uVar1 = 0x1c;
    if (((ulong)receiver.field_0 & 1) == 0) {
      uVar1 = receiver.field_0._0_4_ & 6;
      if (uVar1 == 2) {
        uVar1 = 0x24;
      }
      else if (uVar1 == 4) {
        uVar1 = 0x20;
      }
      else {
        uVar1 = (uint)((ulong)*(undefined8 *)receiver.field_0 >> 0x2a);
      }
    }
    aVar3 = (anon_union_8_4_0eb573b0_for_Oop_0)VMContext::getClassFromIndex(this->context,uVar1);
    if (aVar3.pointer == (uint8_t *)&NilObject) {
      __assert_fail("!isNil(classOop)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/StackInterpreter.cpp"
                    ,0x231,"Behavior *Lodtalk::StackInterpreter::getLookupClass(Oop, bool)");
    }
  }
  else {
    OVar2 = CompiledMethod::getMethodClass(this->method);
    aVar3 = (anon_union_8_4_0eb573b0_for_Oop_0)
            ((anon_union_8_4_0eb573b0_for_Oop_0 *)((long)OVar2.field_0 + 8))->pointer;
  }
  return (Behavior *)aVar3.pointer;
}

Assistant:

Behavior *getLookupClass(Oop receiver, bool superLookup)
    {
        if (superLookup)
        {
            auto methodClass = method->getMethodClass();
            auto behavior = reinterpret_cast<Behavior*> (methodClass.pointer);
            return behavior->superclass;
        }
        else
        {
            auto classIndex = classIndexOf(receiver);
            auto classOop = context->getClassFromIndex(classIndex);
            assert(!isNil(classOop));

            // Cast the class.
            return reinterpret_cast<Behavior*> (classOop.pointer);
        }
    }